

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_barrier_test.cc
# Opt level: O3

void __thiscall
disruptor::test::SequenceBarrierFixture::~SequenceBarrierFixture(SequenceBarrierFixture *this)

{
  pointer ppSVar1;
  
  ppSVar1 = (this->barrier).dependents_.
            super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1);
  }
  ppSVar1 = (this->dependents).
            super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1);
    return;
  }
  return;
}

Assistant:

SequenceBarrierFixture() : barrier(wait_strategy, cursor, dependents) {}